

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

void rdr_freedat(dat_t *dat)

{
  void *in_RDI;
  uint32_t i;
  undefined4 local_c;
  
  for (local_c = 0; local_c < *(uint *)((long)in_RDI + 8); local_c = local_c + 1) {
    rdr_freeseq((seq_t *)0x111be5);
  }
  free(*(void **)((long)in_RDI + 0x10));
  free(in_RDI);
  return;
}

Assistant:

void rdr_freedat(dat_t *dat) {
	for (uint32_t i = 0; i < dat->nseq; i++)
		rdr_freeseq(dat->seq[i]);
	free(dat->seq);
	free(dat);
}